

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLUnknown * __thiscall tinyxml2::XMLDocument::NewUnknown(XMLDocument *this,char *str)

{
  XMLNode *this_00;
  XMLUnknown *unk;
  char *str_local;
  XMLDocument *this_local;
  
  this_00 = (XMLNode *)MemPoolT<88>::Alloc(&this->_commentPool);
  XMLUnknown::XMLUnknown((XMLUnknown *)this_00,this);
  this_00->_memPool = &(this->_commentPool).super_MemPool;
  XMLNode::SetValue(this_00,str,false);
  return (XMLUnknown *)this_00;
}

Assistant:

XMLUnknown* XMLDocument::NewUnknown( const char* str )
{
    TIXMLASSERT( sizeof( XMLUnknown ) == _commentPool.ItemSize() );
    XMLUnknown* unk = new (_commentPool.Alloc()) XMLUnknown( this );
    unk->_memPool = &_commentPool;
    unk->SetValue( str );
    return unk;
}